

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.cpp
# Opt level: O3

float indk::Position::getDistance(Position *L,Position *R)

{
  uint uVar1;
  Error *this;
  ulong uVar2;
  float fVar3;
  float fVar4;
  
  uVar1 = L->DimensionsCount;
  if (uVar1 != R->DimensionsCount) {
    this = (Error *)__cxa_allocate_exception(0x28);
    Error::Error(this,10);
    __cxa_throw(this,&Error::typeinfo,Error::~Error);
  }
  fVar3 = 0.0;
  if ((ulong)uVar1 != 0) {
    uVar2 = 0;
    do {
      fVar4 = L->X[uVar2] - R->X[uVar2];
      fVar3 = fVar3 + fVar4 * fVar4;
      uVar2 = uVar2 + 1;
    } while (uVar1 != uVar2);
  }
  if (0.0 <= fVar3) {
    return SQRT(fVar3);
  }
  fVar3 = sqrtf(fVar3);
  return fVar3;
}

Assistant:

unsigned int indk::Position::getDimensionsCount() const {
    return DimensionsCount;
}